

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
::rebalance_left_to_right
          (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          *right,allocator_type *alloc)

{
  int iVar1;
  undefined8 *puVar2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  bVar3;
  ulong uVar4;
  bool bVar5;
  undefined8 uVar6;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar7;
  uint uVar8;
  ulong uVar9;
  char *__function;
  long lVar10;
  long lVar11;
  int i;
  int iVar12;
  slot_type<S2CellId,_S2PointIndex<int>::PointData> *local_38;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_001bdf05;
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  bVar3 = right[10];
  if ((byte)this[10] < (byte)bVar3) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if (to_move < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62a,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if ((int)(uint)(byte)this[10] < to_move) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                 );
  }
  if ((int)(uint)(byte)bVar3 < to_move) {
    uninitialized_move_n(right,(ulong)(byte)bVar3,0,(ulong)(uint)to_move,right,alloc);
    if ((*(ulong *)this & 7) == 0) {
      local_38 = (slot_type<S2CellId,_S2PointIndex<int>::PointData> *)
                 (*(ulong *)this + (ulong)(byte)this[8] * 0x28 + 0x10);
      btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
      ::value_init<absl::container_internal::slot_type<S2CellId,S2PointIndex<int>::PointData>*>
                ((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                  *)right,(ulong)(to_move - 1U),alloc,&local_38);
      bVar3 = right[10];
      iVar12 = ~(uint)(byte)bVar3 + to_move;
      uninitialized_move_n
                (this,(long)iVar12,(ulong)(byte)this[10] - (long)iVar12,(ulong)(byte)bVar3,right,
                 alloc);
      if ((ulong)(byte)bVar3 != 0) {
        bVar3 = this[10];
        lVar10 = 0x10;
        do {
          pbVar7 = this + lVar10 + (ulong)(byte)bVar3 * 0x28 + (long)(int)(to_move - 1U) * -0x28;
          *(undefined8 *)(right + lVar10) = *(undefined8 *)pbVar7;
          *(undefined4 *)(right + lVar10 + 8) = *(undefined4 *)(pbVar7 + 8);
          uVar6 = *(undefined8 *)(pbVar7 + 0x18);
          *(undefined8 *)(right + lVar10 + 0x10) = *(undefined8 *)(pbVar7 + 0x10);
          *(undefined8 *)(right + lVar10 + 0x10 + 8) = uVar6;
          *(undefined8 *)(right + lVar10 + 0x20) = *(undefined8 *)(pbVar7 + 0x20);
          lVar10 = lVar10 + 0x28;
        } while (pbVar7 + 0x28 != this + (long)(int)((uint)(byte)bVar3 - iVar12) * 0x28 + 0x10);
      }
LAB_001bddd8:
      uVar4 = *(ulong *)this;
      if ((uVar4 & 7) == 0) {
        uVar9 = (ulong)(byte)this[8];
        lVar10 = (ulong)(byte)this[10] - (long)to_move;
        *(undefined8 *)(uVar4 + 0x10 + uVar9 * 0x28) = *(undefined8 *)(this + lVar10 * 0x28 + 0x10);
        *(undefined4 *)(uVar4 + 0x18 + uVar9 * 0x28) = *(undefined4 *)(this + lVar10 * 0x28 + 0x18);
        *(undefined8 *)(uVar4 + 0x30 + uVar9 * 0x28) = *(undefined8 *)(this + lVar10 * 0x28 + 0x30);
        uVar6 = *(undefined8 *)(this + lVar10 * 0x28 + 0x20 + 8);
        puVar2 = (undefined8 *)(uVar4 + 0x20 + uVar9 * 0x28);
        *puVar2 = *(undefined8 *)(this + lVar10 * 0x28 + 0x20);
        puVar2[1] = uVar6;
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
             )0x0) {
          uVar8 = (uint)(byte)right[10];
          do {
            pbVar7 = child(right,uVar8);
            init_child(right,to_move + uVar8,pbVar7);
            mutable_child(right,uVar8);
            bVar5 = 0 < (int)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar5);
          iVar12 = 1;
          if (1 < to_move) {
            iVar12 = to_move;
          }
          i = 0;
          do {
            iVar1 = i + (1 - to_move);
            pbVar7 = child(this,(uint)(byte)this[10] + iVar1);
            init_child(right,i,pbVar7);
            mutable_child(this,(uint)(byte)this[10] + iVar1);
            i = i + 1;
          } while (iVar12 != i);
        }
        this[10] = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                    )((char)this[10] - (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                     )((char)right[10] + (char)to_move);
        return;
      }
    }
  }
  else {
    uninitialized_move_n
              (right,(ulong)(uint)to_move,(long)(int)((uint)(byte)bVar3 - to_move),
               (ulong)(byte)bVar3,right,alloc);
    uVar8 = ~to_move + (uint)(byte)right[10];
    if (-1 < (int)uVar8) {
      lVar10 = (ulong)uVar8 * 0x28 + 0x38;
      pbVar7 = right + (ulong)(byte)right[10] * 0x28 + -8;
      do {
        *(undefined8 *)(pbVar7 + -0x10) = *(undefined8 *)(right + lVar10 + -0x28);
        *(undefined4 *)(pbVar7 + -8) = *(undefined4 *)(right + lVar10 + -0x20);
        uVar6 = *(undefined8 *)(right + lVar10 + -0x18 + 8);
        *(undefined8 *)pbVar7 = *(undefined8 *)(right + lVar10 + -0x18);
        *(undefined8 *)(pbVar7 + 8) = uVar6;
        *(undefined8 *)(pbVar7 + 0x10) = *(undefined8 *)(right + lVar10 + -8);
        lVar10 = lVar10 + -0x28;
        pbVar7 = pbVar7 + -0x28;
      } while (0x37 < lVar10);
    }
    uVar4 = *(ulong *)this;
    if ((uVar4 & 7) == 0) {
      uVar9 = (ulong)(byte)this[8];
      lVar10 = (long)to_move + -1;
      lVar11 = (long)(int)lVar10;
      *(undefined8 *)(right + lVar11 * 0x28 + 0x10) = *(undefined8 *)(uVar4 + 0x10 + uVar9 * 0x28);
      *(undefined4 *)(right + lVar11 * 0x28 + 0x18) = *(undefined4 *)(uVar4 + 0x18 + uVar9 * 0x28);
      *(undefined8 *)(right + lVar11 * 0x28 + 0x30) = *(undefined8 *)(uVar4 + 0x30 + uVar9 * 0x28);
      puVar2 = (undefined8 *)(uVar4 + 0x20 + uVar9 * 0x28);
      uVar6 = puVar2[1];
      *(undefined8 *)(right + lVar11 * 0x28 + 0x20) = *puVar2;
      *(undefined8 *)(right + lVar11 * 0x28 + 0x20 + 8) = uVar6;
      if (lVar10 != 0) {
        bVar3 = this[10];
        lVar10 = 0x10;
        do {
          pbVar7 = this + lVar10 + (ulong)(byte)bVar3 * 0x28 + lVar11 * -0x28;
          *(undefined8 *)(right + lVar10) = *(undefined8 *)pbVar7;
          *(undefined4 *)(right + lVar10 + 8) = *(undefined4 *)(pbVar7 + 8);
          uVar6 = *(undefined8 *)(pbVar7 + 0x18);
          *(undefined8 *)(right + lVar10 + 0x10) = *(undefined8 *)(pbVar7 + 0x10);
          *(undefined8 *)(right + lVar10 + 0x10 + 8) = uVar6;
          *(undefined8 *)(right + lVar10 + 0x20) = *(undefined8 *)(pbVar7 + 0x20);
          lVar10 = lVar10 + 0x28;
        } while (pbVar7 + 0x28 != this + (ulong)(byte)bVar3 * 0x28 + 0x10);
      }
      goto LAB_001bddd8;
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
  ;
LAB_001bdf05:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}